

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::MoleculeStamp::addRigidBodyStamp(MoleculeStamp *this,RigidBodyStamp *rigidbody)

{
  bool bVar1;
  ostream *poVar2;
  OpenMDException *this_00;
  string sStack_1b8;
  ostringstream oss;
  
  bVar1 = addIndexSensitiveStamp<std::vector<OpenMD::RigidBodyStamp*,std::allocator<OpenMD::RigidBodyStamp*>>,OpenMD::RigidBodyStamp>
                    (this,&this->rigidBodyStamps_,rigidbody);
  if (bVar1) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error in Molecule ");
  std::__cxx11::string::string((string *)&sStack_1b8,(string *)&(this->Name).data_);
  poVar2 = std::operator<<(poVar2,(string *)&sStack_1b8);
  poVar2 = std::operator<<(poVar2,": multiple rigidbodies have the same indices: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rigidbody->index_);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&sStack_1b8);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&sStack_1b8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool MoleculeStamp::addRigidBodyStamp(RigidBodyStamp* rigidbody) {
    bool ret = addIndexSensitiveStamp(rigidBodyStamps_, rigidbody);
    if (!ret) {
      std::ostringstream oss;
      oss << "Error in Molecule " << getName()
          << ": multiple rigidbodies have the same indices: "
          << rigidbody->getIndex() << "\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }